

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O2

void __thiscall
unfinished_tasks_test_params_class::~unfinished_tasks_test_params_class
          (unfinished_tasks_test_params_class *this)

{
  (this->super_TestArgsBase)._vptr_TestArgsBase =
       (_func_int **)&PTR__unfinished_tasks_test_params_class_00110b78;
  std::_Tuple_impl<0UL,_TestRange<bool>,_TestRange<unsigned_long>_>::~_Tuple_impl
            (&(this->ranges).super__Tuple_impl<0UL,_TestRange<bool>,_TestRange<unsigned_long>_>);
  TestArgsBase::~TestArgsBase(&this->super_TestArgsBase);
  return;
}

Assistant:

DEFINE_PARAMS_2( unfinished_tasks_test_params,
                 bool, cancel_flag, ({false, true}),
                 size_t, num_threads, ({0, 1, 4}) );

int unfinished_tasks_test(PARAM_BASE) {
    GET_PARAMS(unfinished_tasks_test_params);

    ThreadPoolOptions opt;
    opt.numInitialThreads = unfinished_tasks_test_params->num_threads;
    opt.invokeCanceledTask = unfinished_tasks_test_params->cancel_flag;

    // Initialize thread pool.
    ThreadPoolMgr mgr;
    mgr.init(opt);

    TestSuite::_msgt("begin\n");

    std::mutex mm;

    // 15 async tasks.
    for (size_t ii=0; ii<15; ++ii) {
        mgr.addTask( [ii, &mm](const TaskResult& ret) {
            std::lock_guard<std::mutex> l(mm);
            TestSuite::_msgt("[%02zx] async task %zu, result %d\n",
                             tid_simple(), ii, ret);
            if (ret.ok()) {
                TestSuite::sleep_ms(10);
            }
        } );
    }

    // Recurring timer whose interval is 20 ms.
    mgr.addTask( [](const TaskResult& ret) {
                     TestSuite::_msgt("[%02zx] recurring 20 ms, result %d\n",
                                      tid_simple(), ret);
                 },
                 20*1000,
                 TaskType::RECURRING );

    // One-time timer whose interval is 500 ms.
    mgr.addTask( [](const TaskResult& ret) {
                     TestSuite::_msgt("[%02zx] one-time 500 ms, result %d\n",
                                      tid_simple(), ret);
                 },
                 500000 );

    // Wait 50 ms.
    TestSuite::sleep_ms(50);

    // Shutdown thread pool.
    // If `opt.invokeCanceledTask = true`, unfinished tasks will be fired
    // with `CANCELED` result code. Otherwise, they will be just purged.
    TestSuite::_msgt("shutdown thread pool\n");
    mgr.shutdown();

    return 0;
}

int main(int argc, char** argv) {
    TestSuite test(argc, argv);
    test.options.printTestMessage = true;

    test.doTest( "basic test",
                 basic_test,
                 TestRange<size_t>( {0, 1, 4} ) );

    test.doTest( "recurring test",
                 recurring_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "relay test",
                 relay_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "fast relay test",
                 fast_relay_test,
                 TestRange<int>( {0, 1, 2} ) );

    test.doTest( "reschedule one time test",
                 reschedule_one_time_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "reschedule recurring test",
                 reschedule_recurring_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "mixed test",
                 mixed_test,
                 TestRange<size_t>( {0, 1, 4} ) );

    SET_PARAMS(unfinished_tasks_test_params);
    test.doTest( "unfinished tasks test",
                 unfinished_tasks_test,
                 unfinished_tasks_test_params );

    return 0;
}